

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbrt.cpp
# Opt level: O3

int main(int argc,char **argv)

{
  char **ppcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  undefined **ppuVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint uVar12;
  uint uVar13;
  bool bVar14;
  bool bVar15;
  int iVar16;
  LogLevel LVar17;
  size_t sVar18;
  char *pcVar19;
  string_view str;
  string_view str_00;
  string_view str_01;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  filenames_00;
  span<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  filenames_01;
  bool toPly;
  bool format;
  string pixelBounds;
  string pixel;
  string renderCoordSys;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  filenames;
  string logLevel;
  string cropWindow;
  bool local_1222;
  bool local_1221;
  char **local_1220;
  string local_1218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11f8;
  string local_11d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_11b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1198;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1178;
  string local_1158;
  string local_1138;
  string local_1118;
  string local_10f8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_10d8;
  string local_10b8;
  string local_1098;
  string local_1078;
  string local_1058;
  string local_1038;
  string local_1018;
  string local_ff8;
  string local_fd8;
  string local_fb8;
  string local_f98;
  string local_f78;
  string local_f58;
  string local_f38;
  _Any_data local_f18;
  code *local_f08;
  code *local_f00;
  _Any_data local_ef8;
  code *local_ee8;
  code *local_ee0;
  _Any_data local_ed8;
  code *local_ec8;
  code *local_ec0;
  _Any_data local_eb8;
  code *local_ea8;
  code *local_ea0;
  _Any_data local_e98;
  code *local_e88;
  code *local_e80;
  _Any_data local_e78;
  code *local_e68;
  code *local_e60;
  _Any_data local_e58;
  code *local_e48;
  code *local_e40;
  _Any_data local_e38;
  code *local_e28;
  code *local_e20;
  _Any_data local_e18;
  code *local_e08;
  code *local_e00;
  _Any_data local_df8;
  code *local_de8;
  code *local_de0;
  _Any_data local_dd8;
  code *local_dc8;
  code *local_dc0;
  _Any_data local_db8;
  code *local_da8;
  code *local_da0;
  _Any_data local_d98;
  code *local_d88;
  code *local_d80;
  _Any_data local_d78;
  code *local_d68;
  code *local_d60;
  _Any_data local_d58;
  code *local_d48;
  code *local_d40;
  _Any_data local_d38;
  code *local_d28;
  code *local_d20;
  _Any_data local_d18;
  code *local_d08;
  code *local_d00;
  _Any_data local_cf8;
  code *local_ce8;
  code *local_ce0;
  _Any_data local_cd8;
  code *local_cc8;
  code *local_cc0;
  _Any_data local_cb8;
  code *local_ca8;
  code *local_ca0;
  _Any_data local_c98;
  code *local_c88;
  code *local_c80;
  _Any_data local_c78;
  code *local_c68;
  code *local_c60;
  PBRTOptions local_c58;
  undefined1 local_b60 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_b40;
  polymorphic_allocator<pbrt::ParsedParameter_*> local_b30;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_b28;
  undefined1 local_b20 [64];
  undefined1 local_ae0 [48];
  undefined1 local_ab0 [32];
  polymorphic_allocator<pbrt::ParsedParameter_*> local_a90;
  
  local_1178.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._0_16_ = ZEXT816(0) << 0x40;
  local_c58.imageFile._M_dataplus._M_p = (pointer)((long)&local_c58 + 0x38);
  local_c58.mseReferenceImage._M_dataplus._M_p = (pointer)((long)&local_c58 + 0x58);
  local_c58.mseReferenceOutput._M_dataplus._M_p = (pointer)((long)&local_c58 + 0x78);
  local_c58.super_BasicOptions.renderingSpace = CameraWorld;
  local_c58.logLevel = Error;
  local_c58.pixelSamples.set = false;
  local_c58.gpuDevice.set = false;
  local_c58.imageFile._M_string_length = 0;
  local_c58.imageFile.field_2._M_local_buf[0] = '\0';
  local_c58.mseReferenceImage._M_string_length = 0;
  local_c58.mseReferenceImage.field_2._M_local_buf[0] = '\0';
  local_c58.mseReferenceOutput._M_string_length = 0;
  local_c58.mseReferenceOutput.field_2._M_local_buf[0] = '\0';
  local_c58.debugStart._M_dataplus._M_p = (pointer)((long)&local_c58 + 0x98);
  local_10d8._M_dataplus._M_p = (pointer)&local_10d8.field_2;
  local_c58.displayServer._M_dataplus._M_p = (pointer)((long)&local_c58 + 0xb8);
  local_1178.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_c58.debugStart._M_string_length = 0;
  local_c58.debugStart.field_2._M_local_buf[0] = '\0';
  local_c58.displayServer._M_string_length = 0;
  local_c58.displayServer.field_2._M_local_buf[0] = '\0';
  local_c58.cropWindow.set = false;
  local_c58.pixelBounds.set = false;
  local_1220 = argv;
  local_c58.super_BasicOptions._0_16_ =
       local_1178.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._0_16_;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_10d8,"error","");
  local_1198._M_dataplus._M_p = (pointer)&local_1198.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1198,"cameraworld","");
  local_1221 = false;
  local_1222 = false;
  ppcVar1 = local_1220 + 1;
  pcVar19 = local_1220[1];
  local_1220 = ppcVar1;
  if (pcVar19 != (char *)0x0) {
    ppuVar3 = (undefined **)(local_b60 + 0x10);
    paVar2 = &local_1218.field_2;
    do {
      if (*pcVar19 == '-') {
        local_11f8._M_dataplus._M_p = (pointer)&local_11f8.field_2;
        local_11b8._M_dataplus._M_p = (pointer)&local_11b8.field_2;
        local_b60._8_8_ = 0;
        local_b60[0x10] = 0;
        local_11f8._M_string_length = 0;
        local_11b8._M_string_length = 0;
        local_11f8.field_2._M_local_buf[0] = '\0';
        local_11b8.field_2._M_local_buf[0] = '\0';
        local_1218._M_dataplus._M_p = (pointer)paVar2;
        local_b60._0_8_ = ppuVar3;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1218,"cropwindow","");
        local_c78._M_unused._M_object = (void *)0x0;
        local_c78._8_8_ = 0;
        local_c60 = std::
                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                    ::_M_invoke;
        local_c68 = std::
                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                    ::_M_manager;
        bVar14 = pbrt::ParseArg<std::__cxx11::string*>
                           (&local_1220,&local_1218,
                            (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            local_b60,
                            (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                             *)&local_c78);
        if (local_c68 != (code *)0x0) {
          (*local_c68)(&local_c78,&local_c78,__destroy_functor);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1218._M_dataplus._M_p != paVar2) {
          operator_delete(local_1218._M_dataplus._M_p,
                          CONCAT71(local_1218.field_2._M_allocated_capacity._1_7_,
                                   local_1218.field_2._M_local_buf[0]) + 1);
        }
        if (bVar14) {
          str._M_str = (char *)local_b60._0_8_;
          str._M_len = local_b60._8_8_;
          pbrt::SplitStringToFloats
                    ((optional<std::vector<float,_std::allocator<float>_>_> *)&local_1218,str,',');
          if ((local_1218.field_2._M_local_buf[8] == '\x01') &&
             (local_1218._M_string_length - (long)local_1218._M_dataplus._M_p == 0x10)) {
            auVar10 = vminss_avx(ZEXT416(*(uint *)(local_1218._M_dataplus._M_p + 4)),
                                 ZEXT416(*(uint *)local_1218._M_dataplus._M_p));
            auVar11 = vminss_avx(ZEXT416(*(uint *)(local_1218._M_dataplus._M_p + 0xc)),
                                 ZEXT416(*(uint *)(local_1218._M_dataplus._M_p + 8)));
            auVar8 = vmaxss_avx(ZEXT416(*(uint *)(local_1218._M_dataplus._M_p + 4)),
                                ZEXT416(*(uint *)local_1218._M_dataplus._M_p));
            auVar9 = vmaxss_avx(ZEXT416(*(uint *)(local_1218._M_dataplus._M_p + 0xc)),
                                ZEXT416(*(uint *)(local_1218._M_dataplus._M_p + 8)));
            auVar10 = vinsertps_avx(auVar10,auVar11,0x10);
            auVar8 = vinsertps_avx(auVar8,auVar9,0x10);
            local_c58.cropWindow.optionalValue =
                 (aligned_storage_t<sizeof(pbrt::Bounds2<float>),_alignof(pbrt::Bounds2<float>)>)
                 vmovlhps_avx(auVar10,auVar8);
            local_c58.cropWindow.set = true;
LAB_00242936:
            operator_delete(local_1218._M_dataplus._M_p,
                            CONCAT71(local_1218.field_2._M_allocated_capacity._1_7_,
                                     local_1218.field_2._M_local_buf[0]) -
                            (long)local_1218._M_dataplus._M_p);
LAB_00242943:
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_11b8._M_dataplus._M_p != &local_11b8.field_2) {
              operator_delete(local_11b8._M_dataplus._M_p,
                              CONCAT71(local_11b8.field_2._M_allocated_capacity._1_7_,
                                       local_11b8.field_2._M_local_buf[0]) + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_11f8._M_dataplus._M_p != &local_11f8.field_2) {
              operator_delete(local_11f8._M_dataplus._M_p,
                              CONCAT71(local_11f8.field_2._M_allocated_capacity._1_7_,
                                       local_11f8.field_2._M_local_buf[0]) + 1);
            }
            if ((undefined **)local_b60._0_8_ != ppuVar3) {
              operator_delete((void *)local_b60._0_8_,
                              CONCAT62(local_b60._18_6_,CONCAT11(local_b60[0x11],local_b60[0x10])) +
                              1);
            }
            goto LAB_002429a3;
          }
          local_11d8._M_dataplus._M_p = (pointer)&local_11d8.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_11d8,"Didn\'t find four values after --cropwindow","");
        }
        else {
          local_1218._M_dataplus._M_p = (pointer)paVar2;
          std::__cxx11::string::_M_construct<char_const*>((string *)&local_1218,"pixel","");
          local_c98 = (_Any_data)(ZEXT816(0) << 0x40);
          local_c80 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                      ::_M_invoke;
          local_c88 = std::
                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                      ::_M_manager;
          bVar14 = pbrt::ParseArg<std::__cxx11::string*>
                             (&local_1220,&local_1218,&local_11b8,
                              (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                               *)&local_c98);
          if (local_c88 != (code *)0x0) {
            (*local_c88)(&local_c98,&local_c98,__destroy_functor);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_1218._M_dataplus._M_p != paVar2) {
            operator_delete(local_1218._M_dataplus._M_p,
                            CONCAT71(local_1218.field_2._M_allocated_capacity._1_7_,
                                     local_1218.field_2._M_local_buf[0]) + 1);
          }
          if (bVar14) {
            str_00._M_str = local_11b8._M_dataplus._M_p;
            str_00._M_len = local_11b8._M_string_length;
            pbrt::SplitStringToInts
                      ((optional<std::vector<int,_std::allocator<int>_>_> *)&local_1218,str_00,',');
            if ((local_1218.field_2._M_local_buf[8] == '\x01') &&
               (local_1218._M_string_length - (long)local_1218._M_dataplus._M_p == 8)) {
              local_c58.pixelBounds.optionalValue._0_8_ = *(undefined8 *)local_1218._M_dataplus._M_p
              ;
              local_c58.pixelBounds.optionalValue._8_8_ =
                   CONCAT44(*(uint *)(local_1218._M_dataplus._M_p + 4) + 1,
                            *(uint *)local_1218._M_dataplus._M_p + 1);
LAB_00242926:
              local_c58.pixelBounds.set = true;
              goto LAB_00242936;
            }
            local_11d8._M_dataplus._M_p = (pointer)&local_11d8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_11d8,"Didn\'t find two values after --pixel","");
          }
          else {
            local_1218._M_dataplus._M_p = (pointer)paVar2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&local_1218,"pixelbounds","");
            local_cb8 = (_Any_data)(ZEXT816(0) << 0x40);
            local_ca0 = std::
                        _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                        ::_M_invoke;
            local_ca8 = std::
                        _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                        ::_M_manager;
            bVar14 = pbrt::ParseArg<std::__cxx11::string*>
                               (&local_1220,&local_1218,&local_11f8,
                                (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                 *)&local_cb8);
            if (local_ca8 != (code *)0x0) {
              (*local_ca8)(&local_cb8,&local_cb8,__destroy_functor);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)local_1218._M_dataplus._M_p != paVar2) {
              operator_delete(local_1218._M_dataplus._M_p,
                              CONCAT71(local_1218.field_2._M_allocated_capacity._1_7_,
                                       local_1218.field_2._M_local_buf[0]) + 1);
            }
            if (!bVar14) {
              local_1218._M_dataplus._M_p = (pointer)paVar2;
              std::__cxx11::string::_M_construct<char_const*>((string *)&local_1218,"debugstart","")
              ;
              local_cd8 = (_Any_data)(ZEXT816(0) << 0x40);
              local_cc0 = std::
                          _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                          ::_M_invoke;
              local_cc8 = std::
                          _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                          ::_M_manager;
              bVar14 = pbrt::ParseArg<std::__cxx11::string*>
                                 (&local_1220,&local_1218,
                                  (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)((long)&local_c58 + 0x88),
                                  (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                   *)&local_cd8);
              bVar15 = true;
              if (!bVar14) {
                local_11d8._M_dataplus._M_p = (pointer)&local_11d8.field_2;
                std::__cxx11::string::_M_construct<char_const*>
                          ((string *)&local_11d8,"disable-pixel-jitter","");
                local_cf8 = (_Any_data)(ZEXT816(0) << 0x40);
                local_ce0 = std::
                            _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                            ::_M_invoke;
                local_ce8 = std::
                            _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                            ::_M_manager;
                bVar14 = pbrt::ParseArg<bool*>
                                   (&local_1220,&local_11d8,(bool *)((long)&local_c58 + 0xc),
                                    (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                     *)&local_cf8);
                bVar15 = true;
                if (!bVar14) {
                  local_f38._M_dataplus._M_p = (pointer)&local_f38.field_2;
                  std::__cxx11::string::_M_construct<char_const*>
                            ((string *)&local_f38,"disable-wavelength-jitter","");
                  local_d18 = (_Any_data)(ZEXT816(0) << 0x40);
                  local_d00 = std::
                              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                              ::_M_invoke;
                  local_d08 = std::
                              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                              ::_M_manager;
                  bVar14 = pbrt::ParseArg<bool*>
                                     (&local_1220,&local_f38,(bool *)((long)&local_c58 + 0xd),
                                      (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                       *)&local_d18);
                  bVar15 = true;
                  if (!bVar14) {
                    local_f58._M_dataplus._M_p = (pointer)&local_f58.field_2;
                    std::__cxx11::string::_M_construct<char_const*>
                              ((string *)&local_f58,"display-server","");
                    local_d38 = (_Any_data)(ZEXT816(0) << 0x40);
                    local_d20 = std::
                                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                ::_M_invoke;
                    local_d28 = std::
                                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                ::_M_manager;
                    bVar14 = pbrt::ParseArg<std::__cxx11::string*>
                                       (&local_1220,&local_f58,
                                        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)((long)&local_c58 + 0xa8),
                                        (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                         *)&local_d38);
                    bVar15 = true;
                    if (!bVar14) {
                      local_f78._M_dataplus._M_p = (pointer)&local_f78.field_2;
                      std::__cxx11::string::_M_construct<char_const*>
                                ((string *)&local_f78,"force-diffuse","");
                      local_d58 = (_Any_data)(ZEXT816(0) << 0x40);
                      local_d40 = std::
                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                  ::_M_invoke;
                      local_d48 = std::
                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                  ::_M_manager;
                      bVar14 = pbrt::ParseArg<bool*>
                                         (&local_1220,&local_f78,(bool *)((long)&local_c58 + 0xe),
                                          (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                           *)&local_d58);
                      bVar15 = true;
                      if (!bVar14) {
                        local_f98._M_dataplus._M_p = (pointer)&local_f98.field_2;
                        std::__cxx11::string::_M_construct<char_const*>
                                  ((string *)&local_f98,"format","");
                        local_d78 = (_Any_data)(ZEXT816(0) << 0x40);
                        local_d60 = std::
                                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                    ::_M_invoke;
                        local_d68 = std::
                                    _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                    ::_M_manager;
                        bVar14 = pbrt::ParseArg<bool*>
                                           (&local_1220,&local_f98,&local_1221,
                                            (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                             *)&local_d78);
                        bVar15 = true;
                        if (!bVar14) {
                          local_fb8._M_dataplus._M_p = (pointer)&local_fb8.field_2;
                          std::__cxx11::string::_M_construct<char_const*>
                                    ((string *)&local_fb8,"log-level","");
                          local_d98 = (_Any_data)(ZEXT816(0) << 0x40);
                          local_d80 = std::
                                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                      ::_M_invoke;
                          local_d88 = std::
                                      _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                      ::_M_manager;
                          bVar14 = pbrt::ParseArg<std::__cxx11::string*>
                                             (&local_1220,&local_fb8,&local_10d8,
                                              (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                               *)&local_d98);
                          bVar15 = true;
                          if (!bVar14) {
                            local_fd8._M_dataplus._M_p = (pointer)&local_fd8.field_2;
                            std::__cxx11::string::_M_construct<char_const*>
                                      ((string *)&local_fd8,"mse-reference-image","");
                            local_db8 = (_Any_data)(ZEXT816(0) << 0x40);
                            local_da0 = std::
                                        _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                        ::_M_invoke;
                            local_da8 = std::
                                        _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                        ::_M_manager;
                            bVar14 = pbrt::ParseArg<std::__cxx11::string*>
                                               (&local_1220,&local_fd8,
                                                (basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)((long)&local_c58 + 0x48),
                                                (function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                 *)&local_db8);
                            bVar15 = true;
                            if (!bVar14) {
                              local_ff8._M_dataplus._M_p = (pointer)&local_ff8.field_2;
                              std::__cxx11::string::_M_construct<char_const*>
                                        ((string *)&local_ff8,"mse-reference-out","");
                              local_dd8 = (_Any_data)(ZEXT816(0) << 0x40);
                              local_dc0 = std::
                                          _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                          ::_M_invoke;
                              local_dc8 = std::
                                          _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                          ::_M_manager;
                              bVar14 = pbrt::ParseArg<std::__cxx11::string*>
                                                 (&local_1220,&local_ff8,
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)&local_c58 + 0x68),
                                                  (
                                                  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)&local_dd8);
                              bVar15 = true;
                              if (!bVar14) {
                                local_1018._M_dataplus._M_p = (pointer)&local_1018.field_2;
                                std::__cxx11::string::_M_construct<char_const*>
                                          ((string *)&local_1018,"nthreads","");
                                local_df8 = (_Any_data)(ZEXT816(0) << 0x40);
                                local_de0 = std::
                                            _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                            ::_M_invoke;
                                local_de8 = std::
                                            _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                            ::_M_manager;
                                bVar14 = pbrt::ParseArg<int*>
                                                   (&local_1220,&local_1018,(int *)&local_c58,
                                                    (
                                                  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)&local_df8);
                                bVar15 = true;
                                if (!bVar14) {
                                  local_1038._M_dataplus._M_p = (pointer)&local_1038.field_2;
                                  std::__cxx11::string::_M_construct<char_const*>
                                            ((string *)&local_1038,"outfile","");
                                  local_e18 = (_Any_data)(ZEXT816(0) << 0x40);
                                  local_e00 = std::
                                              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                              ::_M_invoke;
                                  local_e08 = std::
                                              _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                              ::_M_manager;
                                  bVar14 = pbrt::ParseArg<std::__cxx11::string*>
                                                     (&local_1220,&local_1038,
                                                      (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)((long)&local_c58 + 0x28),
                                                  (
                                                  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)&local_e18);
                                  bVar15 = true;
                                  if (!bVar14) {
                                    local_1058._M_dataplus._M_p = (pointer)&local_1058.field_2;
                                    std::__cxx11::string::_M_construct<char_const*>
                                              ((string *)&local_1058,"pixelstats","");
                                    local_e38 = (_Any_data)(ZEXT816(0) << 0x40);
                                    local_e20 = std::
                                                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                                ::_M_invoke;
                                    local_e28 = std::
                                                _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                                ::_M_manager;
                                    bVar14 = pbrt::ParseArg<bool*>
                                                       (&local_1220,&local_1058,
                                                        (bool *)((long)&local_c58 + 10),
                                                        (
                                                  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)&local_e38);
                                    bVar15 = true;
                                    if (!bVar14) {
                                      local_1078._M_dataplus._M_p = (pointer)&local_1078.field_2;
                                      std::__cxx11::string::_M_construct<char_const*>
                                                ((string *)&local_1078,"quick","");
                                      local_e58 = (_Any_data)(ZEXT816(0) << 0x40);
                                      local_e40 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                                  ::_M_invoke;
                                      local_e48 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                                  ::_M_manager;
                                      bVar14 = pbrt::ParseArg<bool*>
                                                         (&local_1220,&local_1078,
                                                          (bool *)((long)&local_c58 + 8),
                                                          (
                                                  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)&local_e58);
                                      bVar15 = true;
                                      if (!bVar14) {
                                        local_1098._M_dataplus._M_p = (pointer)&local_1098.field_2;
                                        std::__cxx11::string::_M_construct<char_const*>
                                                  ((string *)&local_1098,"quiet","");
                                        local_e78 = (_Any_data)(ZEXT816(0) << 0x40);
                                        local_e60 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                                  ::_M_invoke;
                                        local_e68 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                                  ::_M_manager;
                                        bVar14 = pbrt::ParseArg<bool*>
                                                           (&local_1220,&local_1098,
                                                            (bool *)((long)&local_c58 + 9),
                                                            (
                                                  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)&local_e78);
                                        bVar15 = true;
                                        if (!bVar14) {
                                          local_10b8._M_dataplus._M_p = (pointer)&local_10b8.field_2
                                          ;
                                          std::__cxx11::string::_M_construct<char_const*>
                                                    ((string *)&local_10b8,"render-coord-sys","");
                                          local_e98 = (_Any_data)(ZEXT816(0) << 0x40);
                                          local_e80 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                                  ::_M_invoke;
                                          local_e88 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                                  ::_M_manager;
                                          bVar14 = pbrt::ParseArg<std::__cxx11::string*>
                                                             (&local_1220,&local_10b8,&local_1198,
                                                              (
                                                  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)&local_e98);
                                          bVar15 = true;
                                          if (!bVar14) {
                                            local_10f8._M_dataplus._M_p =
                                                 (pointer)&local_10f8.field_2;
                                            std::__cxx11::string::_M_construct<char_const*>
                                                      ((string *)&local_10f8,"seed","");
                                            local_eb8 = (_Any_data)(ZEXT816(0) << 0x40);
                                            local_ea0 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                                  ::_M_invoke;
                                            local_ea8 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                                  ::_M_manager;
                                            bVar14 = pbrt::ParseArg<int*>
                                                               (&local_1220,&local_10f8,
                                                                (int *)((long)&local_c58 + 4),
                                                                (
                                                  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)&local_eb8);
                                            bVar15 = true;
                                            if (!bVar14) {
                                              local_1118._M_dataplus._M_p =
                                                   (pointer)&local_1118.field_2;
                                              std::__cxx11::string::_M_construct<char_const*>
                                                        ((string *)&local_1118,"spp","");
                                              local_ed8 = (_Any_data)(ZEXT816(0) << 0x40);
                                              local_ec0 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                                  ::_M_invoke;
                                              local_ec8 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                                  ::_M_manager;
                                              bVar14 = pbrt::ParseArg<pstd::optional<int>*>
                                                                 (&local_1220,&local_1118,
                                                                  (optional<int> *)
                                                                  ((long)&local_c58 + 0x18),
                                                                  (
                                                  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)&local_ed8);
                                              bVar15 = true;
                                              if (!bVar14) {
                                                local_1138._M_dataplus._M_p =
                                                     (pointer)&local_1138.field_2;
                                                std::__cxx11::string::_M_construct<char_const*>
                                                          ((string *)&local_1138,"toply","");
                                                local_ef8 = (_Any_data)(ZEXT816(0) << 0x40);
                                                local_ee0 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                                  ::_M_invoke;
                                                local_ee8 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                                  ::_M_manager;
                                                bVar14 = pbrt::ParseArg<bool*>
                                                                   (&local_1220,&local_1138,
                                                                    &local_1222,
                                                                    (
                                                  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)&local_ef8);
                                                bVar15 = true;
                                                if (!bVar14) {
                                                  local_1158._M_dataplus._M_p =
                                                       (pointer)&local_1158.field_2;
                                                  std::__cxx11::string::_M_construct<char_const*>
                                                            ((string *)&local_1158,"upgrade","");
                                                  local_f18 = (_Any_data)(ZEXT816(0) << 0x40);
                                                  local_f00 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                                  ::_M_invoke;
                                                  local_f08 = std::
                                                  _Function_handler<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp:127:24)>
                                                  ::_M_manager;
                                                  bVar15 = pbrt::ParseArg<bool*>
                                                                     (&local_1220,&local_1158,
                                                                      (bool *)((long)&local_c58 +
                                                                              0xb),
                                                                      (
                                                  function<void_(std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>)>
                                                  *)&local_f18);
                                                  if (local_f08 != (code *)0x0) {
                                                    (*local_f08)(&local_f18,&local_f18,
                                                                 __destroy_functor);
                                                  }
                                                  if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_1158._M_dataplus._M_p !=
                                                  &local_1158.field_2) {
                                                    operator_delete(local_1158._M_dataplus._M_p,
                                                                    local_1158.field_2.
                                                                    _M_allocated_capacity + 1);
                                                  }
                                                }
                                                if (local_ee8 != (code *)0x0) {
                                                  (*local_ee8)(&local_ef8,&local_ef8,
                                                               __destroy_functor);
                                                }
                                                if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_1138._M_dataplus._M_p !=
                                                  &local_1138.field_2) {
                                                  operator_delete(local_1138._M_dataplus._M_p,
                                                                  local_1138.field_2.
                                                                  _M_allocated_capacity + 1);
                                                }
                                              }
                                              if (local_ec8 != (code *)0x0) {
                                                (*local_ec8)(&local_ed8,&local_ed8,__destroy_functor
                                                            );
                                              }
                                              if ((
                                                  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                  *)local_1118._M_dataplus._M_p !=
                                                  &local_1118.field_2) {
                                                operator_delete(local_1118._M_dataplus._M_p,
                                                                local_1118.field_2.
                                                                _M_allocated_capacity + 1);
                                              }
                                            }
                                            if (local_ea8 != (code *)0x0) {
                                              (*local_ea8)(&local_eb8,&local_eb8,__destroy_functor);
                                            }
                                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                                 *)local_10f8._M_dataplus._M_p !=
                                                &local_10f8.field_2) {
                                              operator_delete(local_10f8._M_dataplus._M_p,
                                                              local_10f8.field_2.
                                                              _M_allocated_capacity + 1);
                                            }
                                          }
                                          if (local_e88 != (code *)0x0) {
                                            (*local_e88)(&local_e98,&local_e98,__destroy_functor);
                                          }
                                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                               *)local_10b8._M_dataplus._M_p != &local_10b8.field_2)
                                          {
                                            operator_delete(local_10b8._M_dataplus._M_p,
                                                            local_10b8.field_2._M_allocated_capacity
                                                            + 1);
                                          }
                                        }
                                        if (local_e68 != (code *)0x0) {
                                          (*local_e68)(&local_e78,&local_e78,__destroy_functor);
                                        }
                                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                             *)local_1098._M_dataplus._M_p != &local_1098.field_2) {
                                          operator_delete(local_1098._M_dataplus._M_p,
                                                          local_1098.field_2._M_allocated_capacity +
                                                          1);
                                        }
                                      }
                                      if (local_e48 != (code *)0x0) {
                                        (*local_e48)(&local_e58,&local_e58,__destroy_functor);
                                      }
                                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                           *)local_1078._M_dataplus._M_p != &local_1078.field_2) {
                                        operator_delete(local_1078._M_dataplus._M_p,
                                                        local_1078.field_2._M_allocated_capacity + 1
                                                       );
                                      }
                                    }
                                    if (local_e28 != (code *)0x0) {
                                      (*local_e28)(&local_e38,&local_e38,__destroy_functor);
                                    }
                                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                         *)local_1058._M_dataplus._M_p != &local_1058.field_2) {
                                      operator_delete(local_1058._M_dataplus._M_p,
                                                      local_1058.field_2._M_allocated_capacity + 1);
                                    }
                                  }
                                  if (local_e08 != (code *)0x0) {
                                    (*local_e08)(&local_e18,&local_e18,__destroy_functor);
                                  }
                                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                       *)local_1038._M_dataplus._M_p != &local_1038.field_2) {
                                    operator_delete(local_1038._M_dataplus._M_p,
                                                    local_1038.field_2._M_allocated_capacity + 1);
                                  }
                                }
                                if (local_de8 != (code *)0x0) {
                                  (*local_de8)(&local_df8,&local_df8,__destroy_functor);
                                }
                                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                     *)local_1018._M_dataplus._M_p != &local_1018.field_2) {
                                  operator_delete(local_1018._M_dataplus._M_p,
                                                  local_1018.field_2._M_allocated_capacity + 1);
                                }
                              }
                              if (local_dc8 != (code *)0x0) {
                                (*local_dc8)(&local_dd8,&local_dd8,__destroy_functor);
                              }
                              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                   *)local_ff8._M_dataplus._M_p != &local_ff8.field_2) {
                                operator_delete(local_ff8._M_dataplus._M_p,
                                                local_ff8.field_2._M_allocated_capacity + 1);
                              }
                            }
                            if (local_da8 != (code *)0x0) {
                              (*local_da8)(&local_db8,&local_db8,__destroy_functor);
                            }
                            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                                 *)local_fd8._M_dataplus._M_p != &local_fd8.field_2) {
                              operator_delete(local_fd8._M_dataplus._M_p,
                                              local_fd8.field_2._M_allocated_capacity + 1);
                            }
                          }
                          if (local_d88 != (code *)0x0) {
                            (*local_d88)(&local_d98,&local_d98,__destroy_functor);
                          }
                          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)local_fb8._M_dataplus._M_p != &local_fb8.field_2) {
                            operator_delete(local_fb8._M_dataplus._M_p,
                                            local_fb8.field_2._M_allocated_capacity + 1);
                          }
                        }
                        if (local_d68 != (code *)0x0) {
                          (*local_d68)(&local_d78,&local_d78,__destroy_functor);
                        }
                        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)local_f98._M_dataplus._M_p != &local_f98.field_2) {
                          operator_delete(local_f98._M_dataplus._M_p,
                                          local_f98.field_2._M_allocated_capacity + 1);
                        }
                      }
                      if (local_d48 != (code *)0x0) {
                        (*local_d48)(&local_d58,&local_d58,__destroy_functor);
                      }
                      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                           *)local_f78._M_dataplus._M_p != &local_f78.field_2) {
                        operator_delete(local_f78._M_dataplus._M_p,
                                        local_f78.field_2._M_allocated_capacity + 1);
                      }
                    }
                    if (local_d28 != (code *)0x0) {
                      (*local_d28)(&local_d38,&local_d38,__destroy_functor);
                    }
                    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)local_f58._M_dataplus._M_p != &local_f58.field_2) {
                      operator_delete(local_f58._M_dataplus._M_p,
                                      local_f58.field_2._M_allocated_capacity + 1);
                    }
                  }
                  if (local_d08 != (code *)0x0) {
                    (*local_d08)(&local_d18,&local_d18,__destroy_functor);
                  }
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_f38._M_dataplus._M_p != &local_f38.field_2) {
                    operator_delete(local_f38._M_dataplus._M_p,
                                    local_f38.field_2._M_allocated_capacity + 1);
                  }
                }
                if (local_ce8 != (code *)0x0) {
                  (*local_ce8)(&local_cf8,&local_cf8,__destroy_functor);
                }
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_11d8._M_dataplus._M_p != &local_11d8.field_2) {
                  operator_delete(local_11d8._M_dataplus._M_p,
                                  local_11d8.field_2._M_allocated_capacity + 1);
                }
              }
              if (local_cc8 != (code *)0x0) {
                (*local_cc8)(&local_cd8,&local_cd8,__destroy_functor);
              }
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1218._M_dataplus._M_p != paVar2) {
                operator_delete(local_1218._M_dataplus._M_p,
                                CONCAT71(local_1218.field_2._M_allocated_capacity._1_7_,
                                         local_1218.field_2._M_local_buf[0]) + 1);
              }
              ppcVar1 = local_1220;
              if (bVar15 != false) goto LAB_00242943;
              pcVar19 = *local_1220;
              iVar16 = strcmp(pcVar19,"--help");
              if (((iVar16 != 0) && (iVar16 = strcmp(pcVar19,"-help"), iVar16 != 0)) &&
                 ((*pcVar19 != '-' || ((pcVar19[1] != 'h' || (pcVar19[2] != '\0')))))) {
                local_1218._M_string_length = 0;
                local_1218.field_2._M_local_buf[0] = '\0';
                local_1218._M_dataplus._M_p = (pointer)paVar2;
                pbrt::detail::stringPrintfRecursive<char*&>
                          (&local_1218,"argument \"%s\" unknown",ppcVar1);
                usage(&local_1218);
                goto LAB_00243d50;
              }
              local_1218._M_string_length = 0;
              local_1218.field_2._M_local_buf[0] = '\0';
              local_1218._M_dataplus._M_p = (pointer)paVar2;
              usage(&local_1218);
              break;
            }
            str_01._M_str = local_11f8._M_dataplus._M_p;
            str_01._M_len = local_11f8._M_string_length;
            pbrt::SplitStringToInts
                      ((optional<std::vector<int,_std::allocator<int>_>_> *)&local_1218,str_01,',');
            if ((local_1218.field_2._M_local_buf[8] == '\x01') &&
               (local_1218._M_string_length - (long)local_1218._M_dataplus._M_p == 0x10)) {
              uVar4 = *(uint *)local_1218._M_dataplus._M_p;
              uVar5 = *(uint *)(local_1218._M_dataplus._M_p + 4);
              uVar6 = *(uint *)(local_1218._M_dataplus._M_p + 8);
              uVar7 = *(uint *)(local_1218._M_dataplus._M_p + 0xc);
              uVar12 = uVar4;
              if ((int)uVar5 < (int)uVar4) {
                uVar12 = uVar5;
              }
              uVar13 = uVar6;
              if ((int)uVar7 < (int)uVar6) {
                uVar13 = uVar7;
              }
              local_c58.pixelBounds.optionalValue._0_8_ = CONCAT44(uVar13,uVar12);
              if ((int)uVar5 < (int)uVar4) {
                uVar5 = uVar4;
              }
              if ((int)uVar7 < (int)uVar6) {
                uVar7 = uVar6;
              }
              local_c58.pixelBounds.optionalValue._8_8_ = CONCAT44(uVar7,uVar5);
              goto LAB_00242926;
            }
            local_11d8._M_dataplus._M_p = (pointer)&local_11d8.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_11d8,"Didn\'t find four integer values after --pixelbounds",
                       "");
          }
        }
        usage(&local_11d8);
        goto LAB_00243cff;
      }
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)local_b60,pcVar19,(allocator<char> *)&local_11f8);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_1178,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b60);
      if ((undefined **)local_b60._0_8_ != ppuVar3) {
        operator_delete((void *)local_b60._0_8_,
                        CONCAT62(local_b60._18_6_,CONCAT11(local_b60[0x11],local_b60[0x10])) + 1);
      }
      local_1220 = local_1220 + 1;
LAB_002429a3:
      pcVar19 = *local_1220;
    } while (pcVar19 != (char *)0x0);
  }
  if ((((local_c58.super_BasicOptions.quiet == false) && (local_1221 == false)) &&
      (local_1222 == false)) && (local_c58.super_BasicOptions.upgrade == false)) {
    printf("pbrt version 4 (built %s at %s)\n","May  2 2025","23:49:54");
    puts("Copyright (c)1998-2020 Matt Pharr, Wenzel Jakob, and Greg Humphreys.");
    puts(
        "The source code to pbrt (but *not* the book contents) is covered by the Apache 2.0 License."
        );
    puts("See the file LICENSE.txt for the conditions of the license.");
    fflush(_stdout);
  }
  iVar16 = std::__cxx11::string::compare((char *)&local_1198);
  if (iVar16 == 0) {
    sVar18 = 0;
  }
  else {
    iVar16 = std::__cxx11::string::compare((char *)&local_1198);
    if (iVar16 == 0) {
      sVar18 = 1;
    }
    else {
      iVar16 = std::__cxx11::string::compare((char *)&local_1198);
      sVar18 = 2;
      if (iVar16 != 0) {
        pbrt::ErrorExit<std::__cxx11::string&>
                  ("%s: unknown rendering coordinate system.",&local_1198);
      }
    }
  }
  local_c58.super_BasicOptions.renderingSpace = (RenderingCoordinateSystem)sVar18;
  if (local_c58.mseReferenceImage._M_string_length == 0) {
    if (local_c58.mseReferenceOutput._M_string_length == 0) goto LAB_00243980;
LAB_00243cff:
    pcVar19 = "Must provide MSE reference image via --mse-reference-image";
  }
  else {
    if (local_c58.mseReferenceOutput._M_string_length != 0) {
LAB_00243980:
      LVar17 = pbrt::LogLevelFromString(&local_10d8);
      local_c58.logLevel = LVar17;
      pbrt::InitPBRT(&local_c58);
      if (((local_1221 == false) && ((local_1222 & 1U) == 0)) &&
         (local_c58.super_BasicOptions.upgrade != true)) {
        pbrt::ParsedScene::ParsedScene((ParsedScene *)local_b60);
        filenames_01.ptr =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)local_1178.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_1178.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5);
        filenames_01.n = sVar18;
        pbrt::ParseFiles((pbrt *)local_b60,
                         (SceneRepresentation *)
                         local_1178.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,filenames_01);
        if (local_c58.super_BasicOptions.useGPU == true) {
LAB_00243d50:
          pbrt::ErrorExit<>("GPU rendering is not supported on this system.");
        }
        pbrt::CPURender((ParsedScene *)local_b60);
        if (pbrt::LOGGING_LogLevel < 1) {
          local_11b8._M_dataplus._M_p = (pointer)pbrt::GetCurrentRSS();
          local_11f8._M_string_length = 0;
          local_11f8.field_2._M_local_buf[0] = '\0';
          local_11f8._M_dataplus._M_p = (pointer)&local_11f8.field_2;
          pbrt::detail::stringPrintfRecursive<unsigned_long>
                    (&local_11f8,"Memory used after post-render cleanup: %s",
                     (unsigned_long *)&local_11b8);
          pbrt::Log(Verbose,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/anderslanglands[P]pbrt-v4/src/pbrt/cmd/pbrt.cpp"
                    ,0xf3,local_11f8._M_dataplus._M_p);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_11f8._M_dataplus._M_p != &local_11f8.field_2) {
            operator_delete(local_11f8._M_dataplus._M_p,
                            CONCAT71(local_11f8.field_2._M_allocated_capacity._1_7_,
                                     local_11f8.field_2._M_local_buf[0]) + 1);
          }
        }
        pbrt::CleanupPBRT();
        pbrt::ParsedScene::~ParsedScene((ParsedScene *)local_b60);
      }
      else {
        local_b30.memoryResource = (memory_resource *)&local_b40;
        local_b60._0_8_ = &PTR_Scale_0309c6c8;
        local_b60._8_8_ = ((ulong)local_b60._8_8_ >> 8 & 0xffffff) << 8;
        local_b60[0x10] = local_1222;
        local_b60[0x11] = local_c58.super_BasicOptions.upgrade;
        local_b20._32_8_ = local_b20 + 0x10;
        local_b40._M_allocated_capacity._0_4_ = 0;
        local_b40._8_8_ = 0;
        local_b20._0_8_ = (ParsedParameter *)0x0;
        local_ae0._16_8_ = local_ae0;
        local_b20._16_4_ = _S_red;
        local_b20._24_8_ = (ParsedParameter *)0x0;
        local_b20._48_8_ = (ParsedParameter *)0x0;
        local_ab0._16_8_ = local_ab0;
        local_ae0._0_4_ = _S_red;
        local_ae0._8_8_ = (_Base_ptr)0x0;
        local_ae0._32_8_ = (char *)0x0;
        local_ab0._0_4_ = _S_red;
        local_ab0._8_8_ = (_Base_ptr)0x0;
        local_a90.memoryResource = (memory_resource *)0x0;
        filenames_00.ptr =
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             ((long)local_1178.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_finish -
              (long)local_1178.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start >> 5);
        filenames_00.n = local_ab0._16_8_;
        local_b28 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_b30.memoryResource;
        local_b20._40_8_ = local_b20._32_8_;
        local_ae0._24_8_ = local_ae0._16_8_;
        local_ab0._24_8_ = local_ab0._16_8_;
        pbrt::ParseFiles((pbrt *)local_b60,
                         (SceneRepresentation *)
                         local_1178.
                         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start,filenames_00);
        pbrt::FormattingScene::~FormattingScene((FormattingScene *)local_b60);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1198._M_dataplus._M_p != &local_1198.field_2) {
        operator_delete(local_1198._M_dataplus._M_p,local_1198.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_10d8._M_dataplus._M_p != &local_10d8.field_2) {
        operator_delete(local_10d8._M_dataplus._M_p,local_10d8.field_2._M_allocated_capacity + 1);
      }
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&local_1178);
      if (local_c58.pixelBounds.set == true) {
        local_c58.pixelBounds.set = false;
      }
      if (local_c58.cropWindow.set == true) {
        local_c58.cropWindow.set = false;
      }
      if (local_c58.displayServer._M_dataplus._M_p != (pointer)((long)&local_c58 + 0xb8U)) {
        operator_delete(local_c58.displayServer._M_dataplus._M_p,
                        CONCAT71(local_c58.displayServer.field_2._M_allocated_capacity._1_7_,
                                 local_c58.displayServer.field_2._M_local_buf[0]) + 1);
      }
      if (local_c58.debugStart._M_dataplus._M_p != (pointer)((long)&local_c58 + 0x98U)) {
        operator_delete(local_c58.debugStart._M_dataplus._M_p,
                        CONCAT71(local_c58.debugStart.field_2._M_allocated_capacity._1_7_,
                                 local_c58.debugStart.field_2._M_local_buf[0]) + 1);
      }
      if (local_c58.mseReferenceOutput._M_dataplus._M_p != (pointer)((long)&local_c58 + 0x78U)) {
        operator_delete(local_c58.mseReferenceOutput._M_dataplus._M_p,
                        CONCAT71(local_c58.mseReferenceOutput.field_2._M_allocated_capacity._1_7_,
                                 local_c58.mseReferenceOutput.field_2._M_local_buf[0]) + 1);
      }
      if (local_c58.mseReferenceImage._M_dataplus._M_p != (pointer)((long)&local_c58 + 0x58U)) {
        operator_delete(local_c58.mseReferenceImage._M_dataplus._M_p,
                        CONCAT71(local_c58.mseReferenceImage.field_2._M_allocated_capacity._1_7_,
                                 local_c58.mseReferenceImage.field_2._M_local_buf[0]) + 1);
      }
      if (local_c58.imageFile._M_dataplus._M_p != (pointer)((long)&local_c58 + 0x38U)) {
        operator_delete(local_c58.imageFile._M_dataplus._M_p,
                        CONCAT71(local_c58.imageFile.field_2._M_allocated_capacity._1_7_,
                                 local_c58.imageFile.field_2._M_local_buf[0]) + 1);
      }
      return 0;
    }
    pcVar19 = "Must provide MSE reference output filename via --mse-reference-out";
  }
  pbrt::ErrorExit<>(pcVar19);
}

Assistant:

int main(int argc, char *argv[]) {
#ifdef NVTX
#ifdef PBRT_IS_WINDOWS
    nvtxNameOsThread(GetCurrentThreadId(), "MAIN_THREAD");
#else
    nvtxNameOsThread(syscall(SYS_gettid), "MAIN_THREAD");
#endif
#endif  // NVTX

    // Declare variables for parsed command line
    PBRTOptions options;
    std::vector<std::string> filenames;
    std::string logLevel = "error";
    std::string renderCoordSys = "cameraworld";
    bool format = false, toPly = false;

    // Process command-line arguments
    ++argv;
    while (*argv != nullptr) {
        if ((*argv)[0] != '-') {
            filenames.push_back(*argv);
            ++argv;
            continue;
        }

        auto onError = [](const std::string &err) {
            usage(err);
            exit(1);
        };

        std::string cropWindow, pixelBounds, pixel;
        if (ParseArg(&argv, "cropwindow", &cropWindow, onError)) {
            pstd::optional<std::vector<Float>> c = SplitStringToFloats(cropWindow, ',');
            if (!c || c->size() != 4) {
                usage("Didn't find four values after --cropwindow");
                return 1;
            }
            options.cropWindow =
                Bounds2f(Point2f((*c)[0], (*c)[2]), Point2f((*c)[1], (*c)[3]));
        } else if (ParseArg(&argv, "pixel", &pixel, onError)) {
            pstd::optional<std::vector<int>> p = SplitStringToInts(pixel, ',');
            if (!p || p->size() != 2) {
                usage("Didn't find two values after --pixel");
                return 1;
            }
            options.pixelBounds =
                Bounds2i(Point2i((*p)[0], (*p)[1]), Point2i((*p)[0] + 1, (*p)[1] + 1));
        } else if (ParseArg(&argv, "pixelbounds", &pixelBounds, onError)) {
            pstd::optional<std::vector<int>> p = SplitStringToInts(pixelBounds, ',');
            if (!p || p->size() != 4) {
                usage("Didn't find four integer values after --pixelbounds");
                return 1;
            }
            options.pixelBounds =
                Bounds2i(Point2i((*p)[0], (*p)[2]), Point2i((*p)[1], (*p)[3]));
        } else if (
#ifdef PBRT_BUILD_GPU_RENDERER
            ParseArg(&argv, "gpu", &options.useGPU, onError) ||
            ParseArg(&argv, "gpu-device", &options.gpuDevice, onError) ||
#endif
            ParseArg(&argv, "debugstart", &options.debugStart, onError) ||
            ParseArg(&argv, "disable-pixel-jitter", &options.disablePixelJitter,
                     onError) ||
            ParseArg(&argv, "disable-wavelength-jitter", &options.disableWavelengthJitter,
                     onError) ||
            ParseArg(&argv, "display-server", &options.displayServer, onError) ||
            ParseArg(&argv, "force-diffuse", &options.forceDiffuse, onError) ||
            ParseArg(&argv, "format", &format, onError) ||
            ParseArg(&argv, "log-level", &logLevel, onError) ||
            ParseArg(&argv, "mse-reference-image", &options.mseReferenceImage, onError) ||
            ParseArg(&argv, "mse-reference-out", &options.mseReferenceOutput, onError) ||
            ParseArg(&argv, "nthreads", &options.nThreads, onError) ||
            ParseArg(&argv, "outfile", &options.imageFile, onError) ||
            ParseArg(&argv, "pixelstats", &options.recordPixelStatistics, onError) ||
            ParseArg(&argv, "quick", &options.quickRender, onError) ||
            ParseArg(&argv, "quiet", &options.quiet, onError) ||
            ParseArg(&argv, "render-coord-sys", &renderCoordSys, onError) ||
            ParseArg(&argv, "seed", &options.seed, onError) ||
            ParseArg(&argv, "spp", &options.pixelSamples, onError) ||
            ParseArg(&argv, "toply", &toPly, onError) ||
            ParseArg(&argv, "upgrade", &options.upgrade, onError)) {
            // success
        } else if ((strcmp(*argv, "--help") == 0) || (strcmp(*argv, "-help") == 0) ||
                   (strcmp(*argv, "-h") == 0)) {
            usage();
            return 0;
        } else {
            usage(StringPrintf("argument \"%s\" unknown", *argv));
            return 1;
        }
    }

    // Print welcome banner
    if (!options.quiet && !format && !toPly && !options.upgrade) {
        printf("pbrt version 4 (built %s at %s)\n", __DATE__, __TIME__);
#ifndef NDEBUG
        LOG_VERBOSE("Running debug build");
        printf("*** DEBUG BUILD ***\n");
#endif  // !NDEBUG
        printf("Copyright (c)1998-2020 Matt Pharr, Wenzel Jakob, and Greg Humphreys.\n");
        printf("The source code to pbrt (but *not* the book contents) is covered "
               "by the Apache 2.0 License.\n");
        printf("See the file LICENSE.txt for the conditions of the license.\n");
        fflush(stdout);
    }

    // Check validity of provided arguments
    if (renderCoordSys == "camera")
        options.renderingSpace = RenderingCoordinateSystem::Camera;
    else if (renderCoordSys == "cameraworld")
        options.renderingSpace = RenderingCoordinateSystem::CameraWorld;
    else if (renderCoordSys == "world")
        options.renderingSpace = RenderingCoordinateSystem::World;
    else
        ErrorExit("%s: unknown rendering coordinate system.", renderCoordSys);

    if (!options.mseReferenceImage.empty() && options.mseReferenceOutput.empty())
        ErrorExit("Must provide MSE reference output filename via "
                  "--mse-reference-out");
    if (!options.mseReferenceOutput.empty() && options.mseReferenceImage.empty())
        ErrorExit("Must provide MSE reference image via --mse-reference-image");

    options.logLevel = LogLevelFromString(logLevel);

    // Initialize pbrt
    InitPBRT(options);

    if (format || toPly || options.upgrade) {
        FormattingScene formattingScene(toPly, options.upgrade);
        ParseFiles(&formattingScene, filenames);
    } else {
        // Parse provided scene description files
        ParsedScene scene;
        ParseFiles(&scene, filenames);

        // Render the scene
        if (options.useGPU)
            GPURender(scene);
        else
            CPURender(scene);

        LOG_VERBOSE("Memory used after post-render cleanup: %s", GetCurrentRSS());
        // Clean up after rendering the scene
        CleanupPBRT();
    }
    return 0;
}